

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(SupportVectorClassifier *a,SupportVectorClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  Kernel *b_00;
  Kernel *a_00;
  
  a_00 = a->kernel_;
  if (a_00 == (Kernel *)0x0) {
    a_00 = (Kernel *)&_Kernel_default_instance_;
  }
  b_00 = b->kernel_;
  if (b_00 == (Kernel *)0x0) {
    b_00 = (Kernel *)&_Kernel_default_instance_;
  }
  bVar2 = operator==(a_00,b_00);
  if (!bVar2) {
    return false;
  }
  bVar2 = operator==(&a->numberofsupportvectorsperclass_,&b->numberofsupportvectorsperclass_);
  if (!bVar2) {
    return false;
  }
  bVar2 = operator==(&a->coefficients_,&b->coefficients_);
  if (!bVar2) {
    return false;
  }
  bVar2 = operator==(&a->rho_,&b->rho_);
  if (!bVar2) {
    return false;
  }
  bVar2 = operator==(&a->proba_,&b->proba_);
  if (!bVar2) {
    return false;
  }
  bVar2 = operator==(&a->probb_,&b->probb_);
  if (!bVar2) {
    return false;
  }
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 4) {
    bVar2 = operator==(&((a->supportVectors_).densesupportvectors_)->vectors_,
                       &((b->supportVectors_).densesupportvectors_)->vectors_);
  }
  else {
    if (uVar1 != 3) goto LAB_002e612a;
    bVar2 = operator==(&((a->supportVectors_).sparsesupportvectors_)->vectors_,
                       &((b->supportVectors_).sparsesupportvectors_)->vectors_);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_002e612a:
  uVar1 = a->_oneof_case_[1];
  if (uVar1 != b->_oneof_case_[1]) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 100) {
      bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                        ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_);
      return bVar2;
    }
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((a->ClassLabels_).int64classlabels_,(b->ClassLabels_).int64classlabels_);
    return bVar2;
  }
  return true;
}

Assistant:

bool operator==(const SupportVectorClassifier& a,
                        const SupportVectorClassifier& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.numberofsupportvectorsperclass() != b.numberofsupportvectorsperclass()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            if (a.proba() != b.proba()) {
                return false;
            }
            if (a.probb() != b.probb()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorClassifier::kSparseSupportVectors:
                    if (a.sparsesupportvectors().vectors() != b.sparsesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::kDenseSupportVectors:
                    if (a.densesupportvectors().vectors() != b.densesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::SUPPORTVECTORS_NOT_SET:
                    break;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case SupportVectorClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case SupportVectorClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case SupportVectorClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }